

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void open_multi_files_kvs_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  fdb_kvs_handle *in_stack_ffffffffffffbaa8;
  hbtrie_iterator *in_stack_ffffffffffffbab0;
  fdb_iterator *in_stack_ffffffffffffbab8;
  size_t in_stack_ffffffffffffbac8;
  wal_iterator *in_stack_ffffffffffffbad0;
  fdb_kvs_handle *in_stack_ffffffffffffbad8;
  wal_item *in_stack_ffffffffffffbae0;
  fdb_kvs_handle *in_stack_ffffffffffffbae8;
  fdb_doc **in_stack_ffffffffffffbb20;
  fdb_iterator *in_stack_ffffffffffffbb28;
  fdb_kvs_info *in_stack_ffffffffffffbc10;
  fdb_kvs_handle *in_stack_ffffffffffffbc18;
  fdb_kvs_config *in_stack_ffffffffffffbc50;
  char *in_stack_ffffffffffffbc58;
  fdb_kvs_handle **in_stack_ffffffffffffbc60;
  fdb_file_handle *in_stack_ffffffffffffbc68;
  fdb_config *in_stack_ffffffffffffbcc8;
  char *in_stack_ffffffffffffbcd0;
  fdb_file_handle **in_stack_ffffffffffffbcd8;
  fdb_seqnum_t in_stack_ffffffffffffbd50;
  fdb_kvs_handle **in_stack_ffffffffffffbd58;
  fdb_kvs_handle *in_stack_ffffffffffffbd60;
  fdb_kvs_handle *apfStack_2558 [1024];
  fdb_kvs_handle *apfStack_558 [7];
  undefined8 uStack_520;
  fdb_kvs_handle *local_518;
  char *local_510;
  fdb_kvs_handle *local_508;
  char *local_500;
  long local_4f8;
  char *local_4f0;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_info kvs_info;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle **snap_kvs;
  fdb_kvs_handle **kvs;
  fdb_file_handle **dbfiles;
  char fname [256];
  char bodybuf [256];
  char keybuf [256];
  int n_kvs;
  int n_files;
  int n;
  int vb;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  uStack_520 = 0x11b558;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_520 = 0x11b565;
  memleak_start();
  kvs = apfStack_558;
  snap_kvs = apfStack_2558;
  iterator = (fdb_iterator *)&stack0xffffffffffffbaa8;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  vb = 0;
  do {
    if (7 < vb) {
      r = 0;
      do {
        if (0x3ff < r) {
          vb = 0;
          do {
            if (7 < vb) {
              r = 0;
              do {
                if (0x3ff < r) {
                  vb = 0;
                  do {
                    if (7 < vb) {
                      r = 0;
                      do {
                        if (0x3ff < r) {
                          fdb_doc_free((fdb_doc *)0x11be2d);
                          r = 0;
                          do {
                            if (0x3ff < r) {
                              vb = 0;
                              do {
                                if (7 < vb) {
                                  r = 0;
                                  do {
                                    if (0x3ff < r) {
                                      fdb_doc_free((fdb_doc *)0x11c181);
                                      vb = 0;
                                      do {
                                        if (7 < vb) {
                                          fdb_shutdown();
                                          memleak_end();
                                          if (open_multi_files_kvs_test::__test_pass == 0) {
                                            fprintf(_stderr,"%s FAILED\n",
                                                    "open multi files kvs test");
                                          }
                                          else {
                                            fprintf(_stderr,"%s PASSED\n",
                                                    "open multi files kvs test");
                                          }
                                          return;
                                        }
                                        fVar1 = fdb_close((fdb_file_handle *)
                                                          in_stack_ffffffffffffbaa8);
                                        if (fVar1 != FDB_RESULT_SUCCESS) {
                                          fprintf(_stderr,"Test failed: %s %d\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                  ,0x10fe);
                                          open_multi_files_kvs_test::__test_pass = 0;
                                          if (fVar1 != FDB_RESULT_SUCCESS) {
                                            __assert_fail("status == FDB_RESULT_SUCCESS",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                  ,0x10fe,"void open_multi_files_kvs_test()");
                                          }
                                        }
                                        vb = vb + 1;
                                      } while( true );
                                    }
                                    fVar1 = fdb_iterator_init(snap_kvs[r],(fdb_iterator **)&rdoc,
                                                              (void *)0x0,0,(void *)0x0,0,2);
                                    if (fVar1 != FDB_RESULT_SUCCESS) {
                                      fprintf(_stderr,"Test failed: %s %d\n",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                              ,0x10f0);
                                      open_multi_files_kvs_test::__test_pass = 0;
                                      if (fVar1 != FDB_RESULT_SUCCESS) {
                                        __assert_fail("status == FDB_RESULT_SUCCESS",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                  ,0x10f0,"void open_multi_files_kvs_test()");
                                      }
                                    }
                                    do {
                                      fVar1 = fdb_iterator_get(in_stack_ffffffffffffbb28,
                                                               in_stack_ffffffffffffbb20);
                                      if (fVar1 == FDB_RESULT_SUCCESS) {
                                        fprintf(_stderr,"Test failed: %s %d\n",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                ,0x10f4);
                                        open_multi_files_kvs_test::__test_pass = 0;
                                        __assert_fail("status != FDB_RESULT_SUCCESS",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                  ,0x10f4,"void open_multi_files_kvs_test()");
                                      }
                                      fVar1 = fdb_iterator_next((fdb_iterator *)
                                                                in_stack_ffffffffffffbaa8);
                                    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
                                    fdb_iterator_close(in_stack_ffffffffffffbab8);
                                    r = r + 0x80;
                                  } while( true );
                                }
                                sprintf((char *)&dbfiles,"dummy_compact%d",(ulong)(uint)vb);
                                fVar1 = fdb_compact((fdb_file_handle *)in_stack_ffffffffffffbab0,
                                                    (char *)in_stack_ffffffffffffbaa8);
                                if (fVar1 != FDB_RESULT_SUCCESS) {
                                  fprintf(_stderr,"Test failed: %s %d\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                          ,0x10e9);
                                  open_multi_files_kvs_test::__test_pass = 0;
                                  if (fVar1 != FDB_RESULT_SUCCESS) {
                                    __assert_fail("status == FDB_RESULT_SUCCESS",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                  ,0x10e9,"void open_multi_files_kvs_test()");
                                  }
                                }
                                vb = vb + 1;
                              } while( true );
                            }
                            for (vb = 0; vb < 10; vb = vb + 1) {
                              sprintf(bodybuf + 0xf8,"key%08d",(ulong)(uint)vb);
                              local_518 = snap_kvs[r];
                              local_510 = bodybuf + 0xf8;
                              strlen(bodybuf + 0xf8);
                              fVar1 = fdb_del_kv(in_stack_ffffffffffffbad8,in_stack_ffffffffffffbad0
                                                 ,in_stack_ffffffffffffbac8);
                              if (fVar1 != FDB_RESULT_SUCCESS) {
                                fprintf(_stderr,"Test failed: %s %d\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                        ,0x10e0);
                                open_multi_files_kvs_test::__test_pass = 0;
                                if (fVar1 != FDB_RESULT_SUCCESS) {
                                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                ,0x10e0,"void open_multi_files_kvs_test()");
                                }
                              }
                            }
                            r = r + 1;
                          } while( true );
                        }
                        vb = 0;
                        fdb_iterator_init((&iterator->handle)[r],(fdb_iterator **)&rdoc,(void *)0x0,
                                          0,(void *)0x0,0,0);
                        do {
                          fVar1 = fdb_iterator_get(in_stack_ffffffffffffbb28,
                                                   in_stack_ffffffffffffbb20);
                          if (fVar1 != FDB_RESULT_SUCCESS) {
                            fprintf(_stderr,"Test failed: %s %d\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                    ,0x10d1);
                            open_multi_files_kvs_test::__test_pass = 0;
                            if (fVar1 != FDB_RESULT_SUCCESS) {
                              __assert_fail("status == FDB_RESULT_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                            ,0x10d1,"void open_multi_files_kvs_test()");
                            }
                          }
                          sprintf(bodybuf + 0xf8,"key%08d",(ulong)(uint)vb);
                          iVar2 = strcmp(bodybuf + 0xf8,pcRam0000000000000020);
                          if (iVar2 != 0) {
                            fprintf(_stderr,"Test failed: %s %d\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                    ,0x10d3);
                            open_multi_files_kvs_test::__test_pass = 0;
                            iVar2 = strcmp(bodybuf + 0xf8,pcRam0000000000000020);
                            if (iVar2 != 0) {
                              __assert_fail("!strcmp(keybuf, (char *)rdoc->key)",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                            ,0x10d3,"void open_multi_files_kvs_test()");
                            }
                          }
                          vb = vb + 1;
                          fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_ffffffffffffbaa8);
                        } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
                        fdb_iterator_close(in_stack_ffffffffffffbab8);
                        r = r + 0x80;
                      } while( true );
                    }
                    fVar1 = fdb_compact((fdb_file_handle *)in_stack_ffffffffffffbab0,
                                        (char *)in_stack_ffffffffffffbaa8);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x10c6);
                      open_multi_files_kvs_test::__test_pass = 0;
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        __assert_fail("status == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                      ,0x10c6,"void open_multi_files_kvs_test()");
                      }
                    }
                    vb = vb + 1;
                  } while( true );
                }
                fdb_get_kvs_info(in_stack_ffffffffffffbc18,in_stack_ffffffffffffbc10);
                if (kvs_info.name != (char *)0xa) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x10be);
                  open_multi_files_kvs_test::__test_pass = 0;
                  if (kvs_info.name != (char *)0xa) {
                    __assert_fail("kvs_info.last_seqnum == (uint64_t)n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                  ,0x10be,"void open_multi_files_kvs_test()");
                  }
                }
                fVar1 = fdb_snapshot_open(in_stack_ffffffffffffbd60,in_stack_ffffffffffffbd58,
                                          in_stack_ffffffffffffbd50);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x10c0);
                  open_multi_files_kvs_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("status == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                  ,0x10c0,"void open_multi_files_kvs_test()");
                  }
                }
                r = r + 0x80;
              } while( true );
            }
            if (vb % 2 == 0) {
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffbaa8,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x10b4);
                open_multi_files_kvs_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0x10b4,"void open_multi_files_kvs_test()");
                }
              }
            }
            else {
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffbaa8,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x10b7);
                open_multi_files_kvs_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0x10b7,"void open_multi_files_kvs_test()");
                }
              }
            }
            vb = vb + 1;
          } while( true );
        }
        for (vb = 0; vb < 10; vb = vb + 1) {
          sprintf(bodybuf + 0xf8,"key%08d",(ulong)(uint)vb);
          sprintf(fname + 0xf8,"value%08d",(ulong)(uint)vb);
          local_508 = snap_kvs[r];
          local_500 = bodybuf + 0xf8;
          sVar3 = strlen(bodybuf + 0xf8);
          local_4f8 = sVar3 + 1;
          local_4f0 = fname + 0xf8;
          strlen(fname + 0xf8);
          fVar1 = fdb_set_kv(in_stack_ffffffffffffbae8,in_stack_ffffffffffffbae0,
                             (size_t)in_stack_ffffffffffffbad8,in_stack_ffffffffffffbad0,
                             in_stack_ffffffffffffbac8);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x10ac);
            open_multi_files_kvs_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x10ac,"void open_multi_files_kvs_test()");
            }
          }
        }
        r = r + 1;
      } while( true );
    }
    sprintf((char *)&dbfiles,"dummy%d",(ulong)(uint)vb);
    fVar1 = fdb_open(in_stack_ffffffffffffbcd8,in_stack_ffffffffffffbcd0,in_stack_ffffffffffffbcc8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x109c);
      open_multi_files_kvs_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x109c,"void open_multi_files_kvs_test()");
      }
    }
    for (r = 0; r < 0x80; r = r + 1) {
      sprintf((char *)&dbfiles,"kvs%d",(ulong)(uint)(vb * 0x80 + r));
      fVar1 = fdb_kvs_open(in_stack_ffffffffffffbc68,in_stack_ffffffffffffbc60,
                           in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x10a1);
        open_multi_files_kvs_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x10a1,"void open_multi_files_kvs_test()");
        }
      }
    }
    vb = vb + 1;
  } while( true );
}

Assistant:

void open_multi_files_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int vb;
    int n = 10;
    int n_files = 8;
    int n_kvs = 128;
    char keybuf[256], bodybuf[256];
    char fname[256];

    fdb_file_handle **dbfiles = alca(fdb_file_handle*, n_files);
    fdb_kvs_handle **kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_kvs_handle **snap_kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_iterator *iterator;
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.durability_opt = FDB_DRB_ASYNC;

    // 1024 kvs via 128 per dbfile
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy%d", j);
        status = fdb_open(&dbfiles[j], fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        for(i=0;i<n_kvs;++i){
            vb = j*n_kvs+i;
            sprintf(fname, "kvs%d", vb);
            status = fdb_kvs_open(dbfiles[j], &kvs[vb], fname, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // load across all kvs
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            sprintf(bodybuf, "value%08d", j);
            status = fdb_set_kv(kvs[i], keybuf, strlen(keybuf)+1, bodybuf, strlen(bodybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // commit
    for(j=0;j<n_files;++j){
        if((j%2)==0){
            status = fdb_commit(dbfiles[j], FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            status = fdb_commit(dbfiles[j], FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // snapshot 1 kvs per file
    for(i=0;i<vb;i+=n_kvs){
        fdb_get_kvs_info(kvs[i], &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);
        status = fdb_snapshot_open(kvs[i], &snap_kvs[i], kvs_info.last_seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact default
    for(j=0;j<n_files;++j){
        status = fdb_compact(dbfiles[j], NULL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapshots
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        j=0;
        fdb_iterator_init(snap_kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(keybuf, "key%08d", j);
            TEST_CHK(!strcmp(keybuf, (char *)rdoc->key));
            j++;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);

    // delete all keys
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            status = fdb_del_kv(kvs[i], keybuf, strlen(keybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }


    // custom compact
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy_compact%d", j);
        status = fdb_compact(dbfiles[j], fname);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate again over actual kvs with no deletes
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        status = fdb_iterator_init(kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);


    // cleanup
    for(j=0;j<n_files;++j){
        status = fdb_close(dbfiles[j]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("open multi files kvs test");
}